

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O1

void __thiscall
spvtools::opt::ScalarReplacementPass::CopyNecessaryMemberDecorationsToVariable
          (ScalarReplacementPass *this,Instruction *from,Instruction *to,uint32_t member_index)

{
  IRContext *pIVar1;
  DecorationManager *this_00;
  uint32_t uVar2;
  array<signed_char,_4UL> aVar3;
  uint32_t uVar4;
  Instruction *pIVar5;
  Instruction *this_01;
  Operand *pOVar6;
  pointer ppIVar7;
  uint uVar8;
  pointer ppIVar9;
  undefined1 local_c8 [40];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_a0;
  uint32_t local_8c;
  Instruction *local_88;
  ScalarReplacementPass *local_80;
  pointer local_78;
  undefined1 local_70 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_50;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_48;
  
  local_88 = to;
  pIVar5 = GetStorageType(this,from);
  pIVar1 = (this->super_MemPass).super_Pass.context_;
  local_80 = this;
  if ((pIVar1->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
    IRContext::BuildDecorationManager(pIVar1);
  }
  this_00 = (pIVar1->decoration_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>._M_head_impl
  ;
  uVar2 = 0;
  if (pIVar5->has_result_id_ == true) {
    uVar2 = Instruction::GetSingleWordOperand(pIVar5,(uint)pIVar5->has_type_id_);
  }
  analysis::DecorationManager::GetDecorationsFor(&local_48,this_00,uVar2,false);
  if (local_48.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_78 = local_48.
               super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    ppIVar7 = local_48.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppIVar9 = local_48.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_8c = member_index;
    do {
      pIVar5 = *ppIVar7;
      if (pIVar5->opcode_ == OpMemberDecorate) {
        uVar8 = (pIVar5->has_result_id_ & 1) + 1;
        if (pIVar5->has_type_id_ == false) {
          uVar8 = (uint)pIVar5->has_result_id_;
        }
        uVar2 = Instruction::GetSingleWordOperand(pIVar5,uVar8 + 1);
        if (uVar2 == member_index) {
          uVar8 = (pIVar5->has_result_id_ & 1) + 1;
          if (pIVar5->has_type_id_ == false) {
            uVar8 = (uint)pIVar5->has_result_id_;
          }
          uVar2 = Instruction::GetSingleWordOperand(pIVar5,uVar8 + 2);
          if ((uVar2 < 0x30) && ((0xf00000000041U >> ((ulong)uVar2 & 0x3f) & 1) != 0)) {
            this_01 = (Instruction *)operator_new(0x70);
            local_c8._0_8_ = (pointer)0x0;
            local_c8._8_8_ = (pointer)0x0;
            local_c8._16_8_ = (pointer)0x0;
            aVar3._M_elems[0] = '\0';
            aVar3._M_elems[1] = '\0';
            aVar3._M_elems[2] = '\0';
            aVar3._M_elems[3] = '\0';
            Instruction::Instruction
                      (this_01,(local_80->super_MemPass).super_Pass.context_,OpDecorate,0,0,
                       (vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                       local_c8);
            std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                      ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                       local_c8);
            if (local_88->has_result_id_ == true) {
              aVar3._M_elems =
                   (_Type)Instruction::GetSingleWordOperand(local_88,(uint)local_88->has_type_id_);
            }
            local_70._0_8_ = &PTR__SmallVector_009488e0;
            local_70._24_8_ = local_70 + 0x10;
            local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
            local_70._8_8_ = 1;
            local_c8._0_4_ = 1;
            local_c8._8_8_ = &PTR__SmallVector_009488e0;
            local_c8._16_8_ = (pointer)0x0;
            local_c8._32_8_ = local_c8 + 0x18;
            local_a0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
            local_70._16_4_ = aVar3._M_elems;
            utils::SmallVector<unsigned_int,_2UL>::operator=
                      ((SmallVector<unsigned_int,_2UL> *)(local_c8 + 8),
                       (SmallVector<unsigned_int,_2UL> *)local_70);
            std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
            emplace_back<spvtools::opt::Operand>(&this_01->operands_,(Operand *)local_c8);
            local_c8._8_8_ = &PTR__SmallVector_009488e0;
            if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 )local_a0._M_head_impl !=
                (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
              std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
              operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&local_a0,local_a0._M_head_impl);
            }
            local_a0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
            local_70._0_8_ = &PTR__SmallVector_009488e0;
            if (local_50._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0)
            {
              std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
              operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&local_50,local_50._M_head_impl);
            }
            uVar2 = Instruction::NumInOperandWords(pIVar5);
            if (2 < uVar2) {
              uVar2 = 2;
              do {
                pOVar6 = Instruction::GetInOperand(pIVar5,uVar2);
                local_c8._0_4_ = pOVar6->type;
                local_c8._8_8_ = &PTR__SmallVector_009488e0;
                local_c8._16_8_ = (pointer)0x0;
                local_c8._32_8_ = local_c8 + 0x18;
                local_a0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
                utils::SmallVector<unsigned_int,_2UL>::operator=
                          ((SmallVector<unsigned_int,_2UL> *)(local_c8 + 8),&pOVar6->words);
                std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
                emplace_back<spvtools::opt::Operand>(&this_01->operands_,(Operand *)local_c8);
                local_c8._8_8_ = &PTR__SmallVector_009488e0;
                if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     )local_a0._M_head_impl !=
                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
                  std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
                  operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              *)&local_a0,local_a0._M_head_impl);
                }
                uVar2 = uVar2 + 1;
                uVar4 = Instruction::NumInOperandWords(pIVar5);
              } while (uVar2 < uVar4);
            }
            pIVar1 = (local_80->super_MemPass).super_Pass.context_;
            if ((pIVar1->valid_analyses_ & kAnalysisDecorations) != kAnalysisNone) {
              analysis::DecorationManager::AddDecoration
                        ((pIVar1->decoration_mgr_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                         .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>
                         ._M_head_impl,this_01);
            }
            ppIVar9 = local_78;
            member_index = local_8c;
            if ((pIVar1->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
              analysis::DefUseManager::AnalyzeInstDefUse
                        ((pIVar1->def_use_mgr_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                         .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                         _M_head_impl,this_01);
            }
            utils::IntrusiveList<spvtools::opt::Instruction>::push_back
                      (&(((pIVar1->module_)._M_t.
                          super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                          .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                        annotations_).super_IntrusiveList<spvtools::opt::Instruction>,this_01);
          }
        }
      }
      ppIVar7 = ppIVar7 + 1;
    } while (ppIVar7 != ppIVar9);
  }
  if (local_48.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ScalarReplacementPass::CopyNecessaryMemberDecorationsToVariable(
    Instruction* from, Instruction* to, uint32_t member_index) {
  Instruction* type_inst = GetStorageType(from);
  for (auto dec_inst :
       get_decoration_mgr()->GetDecorationsFor(type_inst->result_id(), false)) {
    uint32_t decoration;
    if (dec_inst->opcode() == spv::Op::OpMemberDecorate) {
      if (dec_inst->GetSingleWordInOperand(1) != member_index) {
        continue;
      }

      decoration = dec_inst->GetSingleWordInOperand(2u);
      switch (spv::Decoration(decoration)) {
        case spv::Decoration::ArrayStride:
        case spv::Decoration::Alignment:
        case spv::Decoration::AlignmentId:
        case spv::Decoration::MaxByteOffset:
        case spv::Decoration::MaxByteOffsetId:
        case spv::Decoration::RelaxedPrecision: {
          std::unique_ptr<Instruction> new_dec_inst(
              new Instruction(context(), spv::Op::OpDecorate, 0, 0, {}));
          new_dec_inst->AddOperand(
              Operand(SPV_OPERAND_TYPE_ID, {to->result_id()}));
          for (uint32_t i = 2; i < dec_inst->NumInOperandWords(); ++i) {
            new_dec_inst->AddOperand(Operand(dec_inst->GetInOperand(i)));
          }
          context()->AddAnnotationInst(std::move(new_dec_inst));
        } break;
        default:
          break;
      }
    }
  }
}